

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::execute_scale(int *argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  string local_308;
  double local_2e8;
  double fac;
  undefined1 local_2c0 [8];
  geofile primary_geofile;
  undefined1 local_c0 [8];
  string factor;
  string local_98 [8];
  string outfile_name;
  string local_70 [8];
  string geo_file_name;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **argv_local;
  int *argc_local;
  
  local_18 = argv;
  argv_local = (char **)argc;
  if (*argc == 6) {
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,pcVar1,(allocator<char> *)(outfile_name.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(outfile_name.field_2._M_local_buf + 0xf));
    pcVar1 = local_18[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,pcVar1,(allocator<char> *)(factor.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(factor.field_2._M_local_buf + 0xf));
    pcVar1 = local_18[5];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,pcVar1,
               (allocator<char> *)
               ((long)&primary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&primary_geofile.physical_volumes_map._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    bVar2 = GEO::is_e_notation((string *)local_c0);
    if (bVar2) {
      GEO::geofile::geofile((geofile *)local_2c0);
      std::__cxx11::string::string((string *)&fac,local_70);
      iVar3 = GEO::geofile::import_geofile((geofile *)local_2c0,(string *)&fac);
      std::__cxx11::string::~string((string *)&fac);
      if (iVar3 == 0) {
        local_2e8 = std::__cxx11::stod((string *)local_c0,(size_t *)0x0);
        iVar3 = GEO::geofile::scale_data((geofile *)local_2c0,local_2e8);
        if (iVar3 == 0) {
          std::__cxx11::string::string((string *)&local_308,local_98);
          iVar3 = GEO::geofile::export_geofile((geofile *)local_2c0,&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          if (iVar3 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_328,"Export Succeeded.",&local_329);
            print_ln(&local_328);
            std::__cxx11::string::~string((string *)&local_328);
            std::allocator<char>::~allocator(&local_329);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,"Error: Export failed.",&local_351);
            print_ln(&local_350);
            std::__cxx11::string::~string((string *)&local_350);
            std::allocator<char>::~allocator(&local_351);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"Error: Scaling failed.",&local_379);
          print_ln(&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::~allocator(&local_379);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a0,"Error: Import of Geofile failed.",&local_3a1);
        print_ln(&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator(&local_3a1);
      }
      GEO::geofile::~geofile((geofile *)local_2c0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"Error: Scaling factor not valid.",&local_3c9);
      print_ln(&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Error: incorrect argument count.",&local_39);
    print_ln(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void UI::execute_scale(int &argc, char *argv[])
{
    if (argc!=6)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string geo_file_name   = argv[3];
        std::string outfile_name    = argv[4];
        std::string factor          = argv[5];
        if (GEO::is_e_notation(factor))
        {
            GEO::geofile primary_geofile;
            if (primary_geofile.import_geofile(geo_file_name)==EXIT_SUCCESS)
            {
                double fac=std::stod(factor);
                if(primary_geofile.scale_data(fac)==EXIT_SUCCESS)
                {
                    if (primary_geofile.export_geofile(outfile_name)==EXIT_SUCCESS)
                        print_ln("Export Succeeded.");
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Scaling failed.");
            }
            else
                print_ln("Error: Import of Geofile failed.");
        }
        else
            print_ln("Error: Scaling factor not valid.");
    }
}